

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.hpp
# Opt level: O3

void __thiscall Buffer::resize(Buffer *this,usize size)

{
  byte *dest;
  byte *src;
  Memory *pMVar1;
  
  if (this->_capacity < size) {
    this->_capacity = size;
    pMVar1 = (Memory *)operator_new__(size + 1);
    Memory::copy(pMVar1,(EVP_PKEY_CTX *)this->bufferStart,
                 (EVP_PKEY_CTX *)(this->bufferEnd + -(long)this->bufferStart));
    if (this->buffer != (byte *)0x0) {
      operator_delete__(this->buffer);
    }
    this->buffer = (byte *)pMVar1;
    this->bufferStart = (byte *)pMVar1;
    pMVar1 = pMVar1 + size;
  }
  else {
    dest = this->buffer;
    if (dest == (byte *)0x0) {
      return;
    }
    src = this->bufferStart;
    pMVar1 = (Memory *)(src + size);
    if ((Memory *)(dest + this->_capacity) < pMVar1) {
      Memory::move(dest,src,(long)this->bufferEnd - (long)src);
      this->bufferStart = this->buffer;
      pMVar1 = (Memory *)(this->buffer + size);
      this->bufferEnd = (byte *)pMVar1;
      goto LAB_0010b863;
    }
  }
  this->bufferEnd = (byte *)pMVar1;
LAB_0010b863:
  *pMVar1 = (Memory)0x0;
  return;
}

Assistant:

void resize(usize size)
  {
    if(size > _capacity)
    {
        _capacity = size;
      byte* newBuffer = (byte*)new char[size + 1];
      Memory::copy(newBuffer, bufferStart, bufferEnd - bufferStart);
      delete[] (char*)buffer;
      bufferStart = buffer = newBuffer;
      bufferEnd = newBuffer + size;
      *bufferEnd = 0;
    }
    else if(buffer)
    {
      if(bufferStart + size <= buffer + _capacity)
      {
        bufferEnd = bufferStart + size;
        *bufferEnd = 0;
      }
      else
      {
        Memory::move(buffer, bufferStart, bufferEnd - bufferStart);
        bufferStart = buffer;
        bufferEnd = buffer + size;
        *bufferEnd = 0;
      }
    }
  }